

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

bool __thiscall Character::Unequip(Character *this,short item,uchar subloc)

{
  long lVar1;
  undefined6 in_register_00000032;
  bool bVar2;
  
  if (item == 0) {
    return false;
  }
  lVar1 = 0;
  do {
    if ((this->paperdoll)._M_elems[lVar1] == (int)CONCAT62(in_register_00000032,item)) {
      bVar2 = true;
      if ((lVar1 != 10) && (lVar1 != 0xc)) {
        bVar2 = lVar1 == 0xe;
      }
      if (bVar2 == (bool)subloc) {
        (this->paperdoll)._M_elems[lVar1] = 0;
        AddItem(this,item,1);
        CalculateStats(this,true);
        return true;
      }
    }
    lVar1 = lVar1 + 1;
    if (lVar1 == 0xf) {
      return false;
    }
  } while( true );
}

Assistant:

bool Character::Unequip(short item, unsigned char subloc)
{
	if (item == 0)
	{
		return false;
	}

	for (std::size_t i = 0; i < this->paperdoll.size(); ++i)
	{
		if (this->paperdoll[i] == item)
		{
			if (((i == Character::Ring2 || i == Character::Armlet2 || i == Character::Bracer2) ? 1 : 0) == subloc)
			{
				this->paperdoll[i] = 0;
				this->AddItem(item, 1);
				this->CalculateStats();
				return true;
			}
		}
	}

	return false;
}